

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmHttpSplitURI(SyhttpUri *pOut,char *zUri,sxu32 nLen)

{
  sxi32 sVar1;
  ushort **ppuVar2;
  bool bVar3;
  uint local_54;
  sxi32 local_50;
  sxu32 nPassOfft;
  sxi32 rc;
  sxu32 nPos;
  SyString *pComp;
  char *zCur;
  sxu8 bIPv6;
  SyString *pSStack_30;
  sxu8 bHostOnly;
  char *zEnd;
  SyString *pSStack_20;
  sxu32 nLen_local;
  char *zUri_local;
  SyhttpUri *pOut_local;
  
  pSStack_30 = (SyString *)(zUri + nLen);
  zCur._7_1_ = '\0';
  zCur._6_1_ = '\0';
  nPassOfft = 0;
  zEnd._4_4_ = nLen;
  pSStack_20 = (SyString *)zUri;
  zUri_local = (char *)pOut;
  SyZero(pOut,0x90);
  *(SyString **)(zUri_local + 0x80) = pSStack_20;
  *(sxu32 *)(zUri_local + 0x88) = zEnd._4_4_;
  while( true ) {
    bVar3 = false;
    if ((*(int *)(zUri_local + 0x88) != 0) && (bVar3 = false, **(byte **)(zUri_local + 0x80) < 0xc0)
       ) {
      ppuVar2 = __ctype_b_loc();
      bVar3 = ((*ppuVar2)[(int)**(char **)(zUri_local + 0x80)] & 0x2000) != 0;
    }
    if (!bVar3) break;
    *(int *)(zUri_local + 0x88) = *(int *)(zUri_local + 0x88) + -1;
    *(long *)(zUri_local + 0x80) = *(long *)(zUri_local + 0x80) + 1;
  }
  while( true ) {
    bVar3 = false;
    if ((*(int *)(zUri_local + 0x88) != 0) &&
       (bVar3 = false,
       *(byte *)(*(long *)(zUri_local + 0x80) + (ulong)(*(int *)(zUri_local + 0x88) - 1)) < 0xc0)) {
      ppuVar2 = __ctype_b_loc();
      bVar3 = ((*ppuVar2)
               [(int)*(char *)(*(long *)(zUri_local + 0x80) +
                              (ulong)(*(int *)(zUri_local + 0x88) - 1))] & 0x2000) != 0;
    }
    if (!bVar3) break;
    *(int *)(zUri_local + 0x88) = *(int *)(zUri_local + 0x88) + -1;
  }
  local_50 = SyByteFind((char *)pSStack_20,(int)pSStack_30 - (int)pSStack_20,0x2f,&nPassOfft);
  if (local_50 == 0) {
    pComp = (SyString *)((long)&pSStack_20->zString + (ulong)nPassOfft);
    if ((pSStack_20 != pComp) && (pComp[-1].field_0xf == ':')) {
      _rc = (ulong *)(zUri_local + 0x50);
      *_rc = (ulong)pSStack_20;
      *(int *)(zUri_local + 0x58) = ((int)pComp - (int)pSStack_20) + -1;
      while( true ) {
        bVar3 = false;
        if (((int)((long *)_rc)[1] != 0) && (bVar3 = false, *(byte *)*_rc < 0xc0)) {
          ppuVar2 = __ctype_b_loc();
          bVar3 = ((*ppuVar2)[(int)*(char *)*_rc] & 0x2000) != 0;
        }
        if (!bVar3) break;
        *(int *)((long *)_rc + 1) = (int)((long *)_rc)[1] + -1;
        *_rc = *_rc + 1;
      }
    }
    if (*(char *)((long)&pComp->zString + 1) == '/') {
      pSStack_20 = (SyString *)((long)&pComp->zString + 2);
      pComp = pSStack_30;
      local_50 = SyByteFind((char *)pSStack_20,(int)pSStack_30 - (int)pSStack_20,0x2f,&nPassOfft);
      if (local_50 == 0) {
        pComp = (SyString *)((long)&pSStack_20->zString + (ulong)nPassOfft);
      }
    }
    else if ((pComp == pSStack_20) || (pComp[-1].field_0xf == ':')) goto LAB_00132796;
  }
  else {
    pComp = pSStack_30;
    zCur._7_1_ = '\x01';
  }
  local_50 = SyByteFind((char *)pSStack_20,(int)pComp - (int)pSStack_20,0x40,&nPassOfft);
  if (local_50 == 0) {
    if (nPassOfft == 0) {
      pSStack_20 = (SyString *)((long)&pSStack_20->zString + 1);
    }
    else {
      _rc = (ulong *)(zUri_local + 0x60);
      *_rc = (ulong)pSStack_20;
      *(sxu32 *)(zUri_local + 0x68) = nPassOfft;
      local_50 = SyByteFind((char *)pSStack_20,(int)pComp - (int)pSStack_20,0x3a,&local_54);
      if ((local_50 == 0) && (local_54 < nPassOfft)) {
        *(uint *)((long)_rc + 8) = local_54;
        *(ulong *)(zUri_local + 0x70) = (long)&pSStack_20->zString + (ulong)local_54 + 1;
        *(sxu32 *)(zUri_local + 0x78) = (nPassOfft - local_54) + -1;
      }
      pSStack_20 = (SyString *)((long)&pSStack_20->zString + (ulong)(nPassOfft + 1));
    }
  }
  _rc = (ulong *)zUri_local;
  while( true ) {
    bVar3 = false;
    if (pSStack_20 < pComp) {
      ppuVar2 = __ctype_b_loc();
      bVar3 = ((*ppuVar2)[(int)*(char *)&pSStack_20->zString] & 0x2000) != 0;
    }
    if (!bVar3) break;
    pSStack_20 = (SyString *)((long)&pSStack_20->zString + 1);
  }
  *_rc = (ulong)pSStack_20;
  *(int *)((long *)_rc + 1) = (int)pComp - (int)pSStack_20;
  if (*(char *)*_rc == '[') {
    *_rc = *_rc + 1;
    *(undefined4 *)((long *)_rc + 1) = 0;
    do {
      pSStack_20 = (SyString *)((long)&pSStack_20->zString + 1);
      if (*(byte *)&pSStack_20->zString < 0xc0) {
        ppuVar2 = __ctype_b_loc();
        bVar3 = true;
        if (((*ppuVar2)[(int)*(char *)&pSStack_20->zString] & 0x1000) == 0) goto LAB_00132697;
      }
      else {
LAB_00132697:
        bVar3 = *(char *)&pSStack_20->zString == ':';
      }
      if (!bVar3) goto LAB_001326cb;
      *(int *)((long *)_rc + 1) = (int)((long *)_rc)[1] + 1;
    } while( true );
  }
  goto LAB_001326f3;
LAB_001326cb:
  if (*(char *)&pSStack_20->zString != ']') {
    return -0x18;
  }
  pSStack_20 = (SyString *)((long)&pSStack_20->zString + 1);
  zCur._6_1_ = '\x01';
LAB_001326f3:
  local_50 = SyByteFind((char *)pSStack_20,(int)pComp - (int)pSStack_20,0x3a,&nPassOfft);
  if (local_50 == 0) {
    if (zCur._6_1_ == '\0') {
      *(sxu32 *)((long *)_rc + 1) = nPassOfft;
    }
    *(ulong *)(zUri_local + 0x10) = (long)&pSStack_20->zString + (ulong)(nPassOfft + 1);
    *(sxu32 *)(zUri_local + 0x18) = (int)pComp - ((int)pSStack_20 + nPassOfft + 1);
  }
  if (zCur._7_1_ == '\x01') {
    return 0;
  }
LAB_00132796:
  pSStack_20 = pComp;
  _rc = (ulong *)(zUri_local + 0x20);
  *_rc = (ulong)pComp;
  *(int *)(zUri_local + 0x28) = (int)pSStack_30 - (int)pComp;
  if (*(int *)(zUri_local + 0x28) != 0) {
    sVar1 = SyByteFind((char *)pComp,(int)pSStack_30 - (int)pComp,0x3f,&nPassOfft);
    if (sVar1 == 0) {
      *(sxu32 *)(_rc + 1) = nPassOfft;
      _rc = (ulong *)(zUri_local + 0x30);
      *_rc = (long)&pSStack_20->zString + (ulong)(nPassOfft + 1);
      *(sxu32 *)(zUri_local + 0x38) = (int)pSStack_30 - ((int)pSStack_20 + nPassOfft + 1);
    }
    sVar1 = SyByteFind((char *)pSStack_20,(int)pSStack_30 - (int)pSStack_20,0x23,&nPassOfft);
    if (sVar1 == 0) {
      if (_rc == (ulong *)(zUri_local + 0x20)) {
        *(sxu32 *)(_rc + 1) = nPassOfft;
      }
      else {
        if ((long)&pSStack_20->zString + (ulong)nPassOfft < *_rc) {
          return -0xc;
        }
        *(sxu32 *)(_rc + 1) = (int)_rc[1] - ((int)pSStack_30 - ((int)pSStack_20 + nPassOfft));
      }
      *(ulong *)(zUri_local + 0x40) = (long)&pSStack_20->zString + (ulong)(nPassOfft + 1);
      *(sxu32 *)(zUri_local + 0x48) = (int)pSStack_30 - ((int)pSStack_20 + nPassOfft + 1);
    }
  }
  return 0;
}

Assistant:

static sxi32 VmHttpSplitURI(SyhttpUri *pOut, const char *zUri, sxu32 nLen)
 {
	 const char *zEnd = &zUri[nLen];
	 sxu8 bHostOnly = FALSE;
	 sxu8 bIPv6 = FALSE	; 
	 const char *zCur;
	 SyString *pComp;
	 sxu32 nPos = 0;
	 sxi32 rc;
	 /* Zero the structure first */
	 SyZero(pOut, sizeof(SyhttpUri));
	 /* Remove leading and trailing white spaces  */
	 SyStringInitFromBuf(&pOut->sRaw, zUri, nLen);
	 SyStringFullTrim(&pOut->sRaw);
	 /* Find the first '/' separator */
	 rc = SyByteFind(zUri, (sxu32)(zEnd - zUri), '/', &nPos);
	 if( rc != SXRET_OK ){
		 /* Assume a host name only */
		 zCur = zEnd;
		 bHostOnly = TRUE;
		 goto ProcessHost;
	 }
	 zCur = &zUri[nPos];
	 if( zUri != zCur && zCur[-1] == ':' ){
		 /* Extract a scheme:
		  * Not that we can get an invalid scheme here.
		  * Fortunately the caller can discard any URI by comparing this scheme with its 
		  * registered schemes and will report the error as soon as his comparison function
		  * fail.
		  */
	 	pComp = &pOut->sScheme;
		SyStringInitFromBuf(pComp, zUri, (sxu32)(zCur - zUri - 1));
		SyStringLeftTrim(pComp);		
	 }
	 if( zCur[1] != '/' ){
		 if( zCur == zUri || zCur[-1] == ':' ){
		  /* No authority */
		  goto PathSplit;
		}
		 /* There is something here , we will assume its an authority
		  * and someone has forgot the two prefix slashes "//", 
		  * sooner or later we will detect if we are dealing with a malicious
		  * user or not, but now assume we are dealing with an authority
		  * and let the caller handle all the validation process.
		  */
		 goto ProcessHost;
	 }	 
	 zUri = &zCur[2];
	 zCur = zEnd;
	 rc = SyByteFind(zUri, (sxu32)(zEnd - zUri), '/', &nPos);
	 if( rc == SXRET_OK ){
		 zCur = &zUri[nPos];
	 }
 ProcessHost:
	 /* Extract user information if present */
	 rc = SyByteFind(zUri, (sxu32)(zCur - zUri), '@', &nPos);
	 if( rc == SXRET_OK ){
		 if( nPos > 0 ){
			 sxu32 nPassOfft; /* Password offset */
			 pComp = &pOut->sUser;
			 SyStringInitFromBuf(pComp, zUri, nPos);
			 /* Extract the password if available */
			 rc = SyByteFind(zUri, (sxu32)(zCur - zUri), ':', &nPassOfft);
			 if( rc == SXRET_OK && nPassOfft < nPos){
				 pComp->nByte = nPassOfft;
				 pComp = &pOut->sPass;
				 pComp->zString = &zUri[nPassOfft+sizeof(char)];
				 pComp->nByte = nPos - nPassOfft - 1;
			 }
			 /* Update the cursor */
			 zUri = &zUri[nPos+1];
		 }else{
			 zUri++;
		 }
	 }
	 pComp = &pOut->sHost;
	 while( zUri < zCur && SyisSpace(zUri[0])){
		 zUri++;
	 }	
	 SyStringInitFromBuf(pComp, zUri, (sxu32)(zCur - zUri));
	 if( pComp->zString[0] == '[' ){
		 /* An IPv6 Address: Make a simple naive test
		  */
		 zUri++; pComp->zString++; pComp->nByte = 0;
		 while( ((unsigned char)zUri[0] < 0xc0 && SyisHex(zUri[0])) || zUri[0] == ':' ){
			 zUri++; pComp->nByte++;
		 }
		 if( zUri[0] != ']' ){
			 return SXERR_CORRUPT; /* Malformed IPv6 address */
		 }
		 zUri++;
		 bIPv6 = TRUE;
	 }
	 /* Extract a port number if available */
	 rc = SyByteFind(zUri, (sxu32)(zCur - zUri), ':', &nPos);
	 if( rc == SXRET_OK ){
		 if( bIPv6 == FALSE ){
			 pComp->nByte = (sxu32)(&zUri[nPos] - zUri);
		 }
		 pComp = &pOut->sPort;
		 SyStringInitFromBuf(pComp, &zUri[nPos+1], (sxu32)(zCur - &zUri[nPos+1]));	
	 }
	 if( bHostOnly == TRUE ){
		 return SXRET_OK;
	 }
PathSplit:
	 zUri = zCur;
	 pComp = &pOut->sPath;
	 SyStringInitFromBuf(pComp, zUri, (sxu32)(zEnd-zUri));
	 if( pComp->nByte == 0 ){
		 return SXRET_OK; /* Empty path */
	 }
	 if( SXRET_OK == SyByteFind(zUri, (sxu32)(zEnd-zUri), '?', &nPos) ){
		 pComp->nByte = nPos; /* Update path length */
		 pComp = &pOut->sQuery;
		 SyStringInitFromBuf(pComp, &zUri[nPos+1], (sxu32)(zEnd-&zUri[nPos+1]));
	 }
	 if( SXRET_OK == SyByteFind(zUri, (sxu32)(zEnd-zUri), '#', &nPos) ){
		 /* Update path or query length */
		 if( pComp == &pOut->sPath ){
			 pComp->nByte = nPos;
		 }else{
			 if( &zUri[nPos] < (char *)SyStringData(pComp) ){
				 /* Malformed syntax : Query must be present before fragment */
				 return SXERR_SYNTAX;
			 }
			 pComp->nByte -= (sxu32)(zEnd - &zUri[nPos]);
		 }
		 pComp = &pOut->sFragment;
		 SyStringInitFromBuf(pComp, &zUri[nPos+1], (sxu32)(zEnd-&zUri[nPos+1]))
	 }
	 return SXRET_OK;
 }